

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi00.hpp
# Opt level: O2

string * __thiscall
websocketpp::processor::hybi00<websocketpp::config::asio>::get_raw_abi_cxx11_
          (string *__return_storage_ptr__,hybi00<websocketpp::config::asio> *this,response_type *res
          )

{
  string *__rhs;
  response_type temp;
  allocator local_121;
  key_type local_120;
  string local_100;
  response local_e0;
  
  http::parser::response::response(&local_e0,res);
  std::__cxx11::string::string((string *)&local_120,"Sec-WebSocket-Key3",(allocator *)&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(&local_e0.super_parser.m_headers._M_t,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  http::parser::response::raw_abi_cxx11_(&local_120,&local_e0);
  std::__cxx11::string::string((string *)&local_100,"Sec-WebSocket-Key3",&local_121);
  __rhs = http::parser::parser::get_header(&res->super_parser,&local_100);
  std::operator+(__return_storage_ptr__,&local_120,__rhs);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  http::parser::response::~response(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string get_raw(response_type const & res) const {
        response_type temp = res;
        temp.remove_header("Sec-WebSocket-Key3");
        return temp.raw() + res.get_header("Sec-WebSocket-Key3");
    }